

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_grok::llm_build_grok
          (llm_build_grok *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  int iVar1;
  undefined8 uVar2;
  llama_expert_gating_func_type gating_op;
  ggml_tensor *q_cur;
  ggml_tensor *pgVar3;
  ggml_tensor *v_mla;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  ggml_tensor *pgVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  llm_graph_input_attn_kv_unified *plVar9;
  llm_graph_context *this_00;
  ggml_tensor *pgVar10;
  ggml_tensor *gate_exps;
  ggml_tensor *pgVar11;
  pointer plVar12;
  int64_t in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd88;
  llm_graph_context *in_stack_fffffffffffffd90;
  llm_graph_input_attn_kv_unified *inp;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *in_stack_fffffffffffffda0;
  ggml_tensor *pgVar13;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *in_stack_fffffffffffffde8;
  llm_graph_context *in_stack_fffffffffffffdf0;
  llm_graph_context *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *in_stack_fffffffffffffe60;
  ggml_tensor *in_stack_fffffffffffffe68;
  ggml_tensor *in_stack_fffffffffffffe70;
  ggml_tensor *in_stack_fffffffffffffe80;
  ggml_tensor *pgVar15;
  int64_t n_expert_used;
  llm_ffn_op_type type_op;
  ggml_tensor *in_stack_fffffffffffffe98;
  llm_graph_context *in_stack_fffffffffffffea0;
  int il_00;
  ggml_tensor *in_stack_ffffffffffffff68;
  ggml_tensor *in_stack_ffffffffffffff70;
  ggml_tensor *local_78;
  undefined4 in_stack_ffffffffffffff98;
  int iVar16;
  int iVar17;
  int iVar18;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffda0,
             (llm_graph_params *)in_stack_fffffffffffffd98);
  iVar1 = *(int *)(in_RDI->buffer + 0x24);
  if (iVar1 != *(int *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1432,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (iVar1 != *(int *)(in_RDI->buffer + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1433,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  q_cur = llm_graph_context::build_inp_embd(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pgVar3 = (ggml_tensor *)ggml_scale(0x429cc471,in_RDI->src[5],q_cur);
  pgVar11 = pgVar3;
  v_mla = llm_graph_context::build_inp_pos(in_stack_fffffffffffffdf0);
  pgVar4 = (ggml_tensor *)llm_graph_context::build_attn_inp_kv_unified(in_stack_fffffffffffffe30);
  iVar16 = 0;
  while (iVar17 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20), (long)iVar16 < in_RDI->ne[3]) {
    pgVar15 = pgVar11;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    iVar18 = (int)pgVar15;
    llm_graph_context::build_norm
              ((llm_graph_context *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (ggml_tensor *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
               in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
               (int)in_stack_fffffffffffffd90);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    local_78 = llm_graph_context::build_lora_mm
                         (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                          in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar17);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar16);
    pgVar15 = pgVar4;
    if (pvVar5->bq != (ggml_tensor *)0x0) {
      pgVar15 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar16);
      local_78 = (ggml_tensor *)ggml_add(pgVar15,local_78,pvVar5->bq);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar17);
      pgVar15 = pgVar4;
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar4 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar17);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar16);
    if (pvVar5->bk != (ggml_tensor *)0x0) {
      pgVar6 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar16);
      pgVar4 = (ggml_tensor *)ggml_add(pgVar6,pgVar4,pvVar5->bk);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar17);
    }
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar6 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                        in_stack_fffffffffffffde0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar17);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar16);
    if (pvVar5->bv != (ggml_tensor *)0x0) {
      pgVar13 = in_RDI->src[5];
      pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)iVar16);
      pgVar6 = (ggml_tensor *)ggml_add(pgVar13,pgVar6,pvVar5->bv);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,iVar17);
    }
    uVar7 = ggml_reshape_3d(in_RDI->src[5],local_78,iVar1,in_RDI->nb[3],
                            (long)*(int *)(in_RDI->src + 2));
    uVar8._0_4_ = in_RDI->op;
    uVar8._4_4_ = in_RDI->op_params[0];
    uVar8 = ggml_reshape_3d(in_RDI->src[5],pgVar4,iVar1,uVar8,(long)*(int *)(in_RDI->src + 2));
    uVar2._0_4_ = in_RDI->op;
    uVar2._4_4_ = in_RDI->op_params[0];
    plVar9 = (llm_graph_input_attn_kv_unified *)
             ggml_reshape_3d(in_RDI->src[5],pgVar6,iVar1,uVar2,(long)*(int *)(in_RDI->src + 2));
    inp = plVar9;
    gating_op = ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                              in_RDI->flags,*(undefined4 *)in_RDI->src,
                              *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar7,v_mla,0,
                              (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    il_00 = (int)plVar9;
    this_00 = (llm_graph_context *)
              ggml_rope_ext(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                            in_RDI->flags,*(undefined4 *)in_RDI->src,
                            *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar8,v_mla,0,
                            (int)in_RDI->nb[0],*(undefined4 *)(in_RDI->src + 4));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar17);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar17);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,iVar17);
    n_expert_used = in_RCX;
    pgVar4 = pgVar15;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar16);
    type_op = (llm_ffn_op_type)pvVar5->wo;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar16);
    pgVar13 = (ggml_tensor *)0x0;
    pgVar6 = (ggml_tensor *)0x0;
    iVar17 = iVar16;
    local_48 = llm_graph_context::build_attn
                         (this_00,inp,(ggml_cgraph *)in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68,in_RDI,q_cur,pgVar11,
                          (ggml_tensor *)CONCAT44(iVar16,in_stack_ffffffffffffff98),pgVar4,v_mla,
                          (float)((ulong)pgVar3 >> 0x20),iVar18);
    iVar18 = (int)((ulong)this_00 >> 0x20);
    if ((long)iVar17 == in_RDI->ne[3] + -1) {
      in_stack_fffffffffffffe80 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffde0);
      in_stack_ffffffffffffff70 = in_stack_fffffffffffffe80;
      local_48 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_48,in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe70 =
           (ggml_tensor *)ggml_get_rows(in_RDI->src[5],pgVar11,in_stack_ffffffffffffff70);
      pgVar11 = in_stack_fffffffffffffe70;
    }
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar17);
    if (pvVar5->attn_out_norm != (ggml_tensor *)0x0) {
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17
                );
      pgVar10 = llm_graph_context::build_norm
                          ((llm_graph_context *)
                           CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (ggml_tensor *)CONCAT44(in_stack_fffffffffffffdac,iVar16),pgVar13,pgVar6,
                           (llm_norm_type)((ulong)inp >> 0x20),(int)inp);
      in_stack_fffffffffffffe68 = pgVar10;
      llm_graph_context::cb((llm_graph_context *)pgVar13,pgVar6,(char *)inp,iVar18);
      in_stack_fffffffffffffe60 = local_48;
      local_48 = pgVar10;
    }
    pgVar10 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_48,pgVar11);
    pgVar11 = pgVar10;
    llm_graph_context::cb((llm_graph_context *)pgVar13,pgVar6,(char *)inp,iVar18);
    in_stack_ffffffffffffff68 = pgVar11;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    gate_exps = llm_graph_context::build_norm
                          ((llm_graph_context *)
                           CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                           (ggml_tensor *)CONCAT44(in_stack_fffffffffffffdac,iVar16),pgVar13,pgVar6,
                           (llm_norm_type)((ulong)inp >> 0x20),(int)inp);
    llm_graph_context::cb((llm_graph_context *)pgVar13,pgVar6,(char *)inp,iVar18);
    uVar14 = (undefined4)((ulong)pgVar13 >> 0x20);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17);
    in_stack_fffffffffffffd90 = *(llm_graph_context **)(in_RDI->op_params + 9);
    in_stack_fffffffffffffd98 = *(ggml_tensor **)(in_RDI->op_params + 0xb);
    in_stack_fffffffffffffdb0 = 0;
    in_stack_fffffffffffffda8 = 1;
    in_stack_fffffffffffffda0 = (ggml_tensor *)CONCAT44(uVar14,1);
    in_stack_fffffffffffffd88 = (ggml_tensor *)0x0;
    local_48 = llm_graph_context::build_moe_ffn
                         ((llm_graph_context *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                          in_stack_fffffffffffffe60,pgVar10,gate_exps,pgVar11,
                          in_stack_fffffffffffffe80,(int64_t)pgVar15,n_expert_used,type_op,
                          SUB81((ulong)in_stack_fffffffffffffe40 >> 0x38,0),
                          SUB81((ulong)in_stack_fffffffffffffe40 >> 0x30,0),
                          SUB84(in_stack_fffffffffffffe40,0),gating_op,il_00);
    in_stack_fffffffffffffe40 = local_48;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar17);
    if (pvVar5->layer_out_norm != (ggml_tensor *)0x0) {
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar17
                );
      local_48 = llm_graph_context::build_norm
                           ((llm_graph_context *)
                            CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                            (ggml_tensor *)
                            CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                            in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                            (llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                            (int)in_stack_fffffffffffffd90);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                 (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    }
    ggml_add(in_RDI->src[5],local_48,in_stack_ffffffffffffff68);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    pgVar11 = llm_graph_context::build_cvec(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (char *)in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    iVar16 = iVar17 + 1;
  }
  pgVar4 = llm_graph_context::build_norm
                     ((llm_graph_context *)
                      CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                      (ggml_tensor *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                      in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                      (int)in_stack_fffffffffffffd90);
  pgVar11 = pgVar4;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (char *)in_stack_fffffffffffffd90,iVar17);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4c42c8);
  plVar12->t_embd = pgVar4;
  pgVar11 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)pgVar11,in_stack_fffffffffffffde8,pgVar4);
  pgVar11 = (ggml_tensor *)ggml_scale(0x3f13cd3a,in_RDI->src[5],pgVar11);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
             (char *)in_stack_fffffffffffffd90,iVar17);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4c4385);
  plVar12->t_logits = pgVar11;
  ggml_build_forward_expand(in_RCX,pgVar11);
  return;
}

Assistant:

llm_build_grok(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // multiply by embedding_multiplier_scale of 78.38367176906169
        inpL = ggml_scale(ctx0, inpL, 78.38367176906169f);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);


            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                cb(Qcur, "Qcur", il);
                if (model.layers[il].bq) {
                    Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    cb(Qcur, "Qcur", il);
                }

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                cb(Kcur, "Kcur", il);
                if (model.layers[il].bk) {
                    Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    cb(Kcur, "Kcur", il);
                }

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                cb(Vcur, "Vcur", il);
                if (model.layers[il].bv) {
                    Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    cb(Vcur, "Vcur", il);
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f, il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            // Grok
            // if attn_out_norm is present then apply it before adding the input
            if (model.layers[il].attn_out_norm) {
                cur = build_norm(cur,
                        model.layers[il].attn_out_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "attn_out_norm", il);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            // MoE branch
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_moe_ffn(cur,
                    model.layers[il].ffn_gate_inp,
                    model.layers[il].ffn_up_exps,
                    model.layers[il].ffn_gate_exps,
                    model.layers[il].ffn_down_exps,
                    nullptr,
                    n_expert, n_expert_used,
                    LLM_FFN_GELU, true,
                    false, 0.0,
                    LLAMA_EXPERT_GATING_FUNC_TYPE_SOFTMAX,
                    il);
            cb(cur, "ffn_moe_out", il);

            // Grok
            // if layer_out_norm is present then apply it before adding the input
            // Idea: maybe ffn_out_norm is a better name
            if (model.layers[il].layer_out_norm) {
                cur = build_norm(cur,
                        model.layers[il].layer_out_norm, NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "layer_out_norm", il);
            }

            cur = ggml_add(ctx0, cur, ffn_inp);
            cb(cur, "ffn_out", il);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        // Grok
        // multiply logits by output_multiplier_scale of 0.5773502691896257

        cur = ggml_scale(ctx0, cur, 0.5773502691896257f);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }